

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_sock_write_from_fd(int fd,fio_packet_s *packet)

{
  ssize_t sVar1;
  int *piVar2;
  bool bVar3;
  size_t local_c050;
  undefined1 local_c038 [8];
  char buff [49152];
  long local_30;
  ssize_t total;
  ssize_t sent;
  ssize_t asked;
  fio_packet_s *packet_local;
  int fd_local;
  
  total = 0;
  local_30 = 0;
  do {
    packet->offset = total + packet->offset;
    packet->length = packet->length - total;
    while( true ) {
      if (packet->length < 0xc000) {
        local_c050 = packet->length;
      }
      else {
        local_c050 = 0xc000;
      }
      sVar1 = pread((int)(packet->data).fd,local_c038,local_c050,packet->offset);
      if (0 < sVar1) break;
      if (total == 0) {
        fio_sock_packet_rotate_unsafe((long)fd);
        return 1;
      }
      piVar2 = __errno_location();
      if (((*piVar2 != 0xb) && (piVar2 = __errno_location(), *piVar2 != 0xb)) &&
         (piVar2 = __errno_location(), *piVar2 != 4)) {
        return -1;
      }
    }
    total = (**(code **)(*(long *)((long)fio_data + (long)fd * 0xa8 + 0xa8) + 8))
                      ((long)CONCAT41(fd,*(undefined1 *)((long)fio_data + (long)fd * 0xa8 + 0x6d)),
                       *(undefined8 *)((long)fio_data + (long)fd * 0xa8 + 0xb0),local_c038,sVar1);
    bVar3 = false;
    if (total == sVar1) {
      bVar3 = packet->length != 0;
    }
    if (!bVar3) {
      if (-1 < total) {
        packet->offset = total + packet->offset;
        packet->length = packet->length - total;
        local_30 = total;
        if (packet->length == 0) {
          fio_sock_packet_rotate_unsafe((long)fd);
          return 1;
        }
      }
      return (int)local_30;
    }
  } while( true );
}

Assistant:

static int fio_sock_write_from_fd(int fd, fio_packet_s *packet) {
  ssize_t asked = 0;
  ssize_t sent = 0;
  ssize_t total = 0;
  char buff[BUFFER_FILE_READ_SIZE];
  do {
    packet->offset += sent;
    packet->length -= sent;
  retry:
    asked = pread(packet->data.fd, buff,
                  ((packet->length < BUFFER_FILE_READ_SIZE)
                       ? packet->length
                       : BUFFER_FILE_READ_SIZE),
                  packet->offset);
    if (asked <= 0)
      goto read_error;
    sent = fd_data(fd).rw_hooks->write(fd2uuid(fd), fd_data(fd).rw_udata, buff,
                                       asked);
  } while (sent == asked && packet->length);
  if (sent >= 0) {
    packet->offset += sent;
    packet->length -= sent;
    total += sent;
    if (!packet->length) {
      fio_sock_packet_rotate_unsafe(fd);
      return 1;
    }
  }
  return total;

read_error:
  if (sent == 0) {
    fio_sock_packet_rotate_unsafe(fd);
    return 1;
  }
  if (errno == EAGAIN || errno == EWOULDBLOCK || errno == EINTR)
    goto retry;
  return -1;
}